

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O1

void __thiscall sptk::reaper::EpochTracker::EpochTracker(EpochTracker *this)

{
  this->_vptr_EpochTracker = (_func_int **)&PTR__EpochTracker_00136c38;
  memset(&this->resid_peaks_,0,0x120);
  this->sample_rate_ = -1.0;
  (this->debug_name_)._M_dataplus._M_p = (pointer)&(this->debug_name_).field_2;
  (this->debug_name_)._M_string_length = 0;
  (this->debug_name_).field_2._M_local_buf[0] = '\0';
  SetParameters(this);
  return;
}

Assistant:

EpochTracker::EpochTracker(void) : sample_rate_(-1.0) {
  SetParameters();
}